

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O2

wchar_t square_num_walls_adjacent(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  _Bool _Var2;
  loc lVar3;
  square *psVar4;
  uint uVar5;
  
  _Var1 = square_in_bounds(c,grid);
  if (_Var1) {
    lVar3 = next_grid(grid,L'\x02');
    psVar4 = square(c,lVar3);
    _Var1 = feat_is_wall((uint)psVar4->feat);
    lVar3 = next_grid(grid,L'\b');
    psVar4 = square(c,lVar3);
    _Var2 = feat_is_wall((uint)psVar4->feat);
    uVar5 = _Var1 + 1;
    if (!_Var2) {
      uVar5 = (uint)_Var1;
    }
    lVar3 = next_grid(grid,L'\x06');
    psVar4 = square(c,lVar3);
    _Var1 = feat_is_wall((uint)psVar4->feat);
    lVar3 = next_grid(grid,L'\x04');
    psVar4 = square(c,lVar3);
    _Var2 = feat_is_wall((uint)psVar4->feat);
    return (uint)_Var2 + (uint)_Var1 + uVar5;
  }
  __assert_fail("square_in_bounds(c, grid)",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave-square.c"
                ,0x4b0,"int square_num_walls_adjacent(struct chunk *, struct loc)");
}

Assistant:

int square_num_walls_adjacent(struct chunk *c, struct loc grid)
{
    int k = 0;
    assert(square_in_bounds(c, grid));

    if (feat_is_wall(square(c, next_grid(grid, DIR_S))->feat)) k++;
	if (feat_is_wall(square(c, next_grid(grid, DIR_N))->feat)) k++;
    if (feat_is_wall(square(c, next_grid(grid, DIR_E))->feat)) k++;
    if (feat_is_wall(square(c, next_grid(grid, DIR_W))->feat)) k++;

    return k;
}